

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

void walk_ports_recurse(Port *p,char *name_buffer,size_t buffer_size,Ports *base,void *data,
                       port_walker_t walker,void *runtime,char *old_end,bool expand_bundles,
                       bool ranges)

{
  size_t sVar1;
  Ports *in_RCX;
  size_t in_RDX;
  char *in_RSI;
  Port *in_RDI;
  void *in_R8;
  port_walker_t in_R9;
  port_walker_t in_stack_00000008;
  long in_stack_00000010;
  byte in_stack_00000018;
  byte in_stack_00000020;
  RtData r;
  char locbuf [1024];
  char buf [1024];
  char *buf_ptr;
  bool enabled;
  char *in_stack_fffffffffffff6d8;
  RtData *in_stack_fffffffffffff6e0;
  char *in_stack_fffffffffffff6e8;
  undefined7 in_stack_fffffffffffff6f0;
  undefined1 in_stack_fffffffffffff6f7;
  char *local_8b8;
  size_t in_stack_fffffffffffff750;
  undefined2 uVar2;
  port_walker_t in_stack_fffffffffffff758;
  void *in_stack_fffffffffffff760;
  Port *in_stack_fffffffffffff768;
  char *in_stack_fffffffffffff770;
  Ports *in_stack_fffffffffffff778;
  void *in_stack_fffffffffffff7a0;
  char local_848 [1024];
  char local_448 [1032];
  char *local_40;
  bool local_33;
  byte local_32;
  byte local_31;
  port_walker_t local_30;
  void *local_28;
  Ports *local_20;
  size_t local_18;
  char *local_10;
  Port *local_8;
  
  uVar2 = (undefined2)(in_stack_fffffffffffff750 >> 0x30);
  local_31 = in_stack_00000018 & 1;
  local_32 = in_stack_00000020 & 1;
  local_33 = true;
  if (in_stack_00000008 != (port_walker_t)0x0) {
    in_stack_fffffffffffff770 = local_448;
    local_30 = in_R9;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    memset(in_stack_fffffffffffff770,0,0x400);
    fast_strcpy((char *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,0x108fdb);
    sVar1 = strlen(in_stack_fffffffffffff770);
    strncat(in_stack_fffffffffffff770,"pointer",0x3ff - sVar1);
    strlen(in_stack_fffffffffffff770);
    fast_strcpy((char *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,0x109021);
    local_40 = local_448 + (in_stack_00000010 - (long)local_10);
    fast_strcpy((char *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,0x109063);
    rtosc::RtData::RtData((RtData *)&stack0xfffffffffffff740);
    uVar2 = 0;
    local_8b8 = local_848;
    in_stack_fffffffffffff758 = in_stack_00000008;
    in_stack_fffffffffffff768 = local_8;
    std::function<void_(const_char_*,_rtosc::RtData_&)>::operator()
              ((function<void_(const_char_*,_rtosc::RtData_&)> *)
               CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
    local_33 = in_stack_fffffffffffff758 != (port_walker_t)0x0;
    if (local_33) {
      local_33 = port_is_enabled(local_8,local_10,local_18,local_20,in_stack_00000008,true,local_30,
                                 local_28);
    }
    rtosc::RtData::~RtData((RtData *)&stack0xfffffffffffff740);
  }
  if ((local_33 & 1U) != 0) {
    rtosc::walk_ports(in_stack_fffffffffffff778,in_stack_fffffffffffff770,
                      (size_t)in_stack_fffffffffffff768,in_stack_fffffffffffff760,
                      in_stack_fffffffffffff758,SUB21((ushort)uVar2 >> 8,0),
                      in_stack_fffffffffffff7a0,SUB21(uVar2,0));
  }
  return;
}

Assistant:

static void walk_ports_recurse(const Port& p, char* name_buffer,
                               size_t buffer_size, const Ports& base,
                               void* data, port_walker_t walker,
                               void* runtime, const char* old_end,
                               bool expand_bundles, bool ranges)
{
    // TODO: all/most of these checks must also be done for the
    // first, non-recursive call
    bool enabled = true;
    if(runtime)
    {
        // get child runtime and check if it's NULL

        assert(old_end >= name_buffer);
        assert(old_end - name_buffer <= 255);

        const char* buf_ptr;
        char buf[1024] = "";
        fast_strcpy(buf, name_buffer, sizeof(buf));
        // there is no "pointer" callback. thus, there will be nothing
        // dispatched, but the rRecur*Cb already have set r.obj
        // that way, we get our pointer
        strncat(buf, "pointer", sizeof(buf) - strlen(buf) - 1);
        assert(1024 - strlen(buf) >= 8);
        fast_strcpy(buf + strlen(buf) + 1, ",", 2);

        buf_ptr = buf + (old_end - name_buffer);

        char locbuf[1024];
        fast_strcpy(locbuf, name_buffer, sizeof(locbuf));
        RtData r;
        r.obj = runtime; // runtime object of the port that contains p
        r.port = &p;
        r.message = buf;
        r.loc = locbuf;
        r.loc_size = sizeof(locbuf);

        p.cb(buf_ptr, r); // call "pointer" callback (see above)
        // if there is runtime information (see above), but this pointer
        // is NULL, the port is not enabled
        enabled = (bool) r.obj; // r.obj = the next runtime object
        if(enabled)
        {
            // check if the port is disabled by a switch
            enabled = port_is_enabled(&p, name_buffer, buffer_size,
                                      base, runtime, true, walker, data);
            runtime = r.obj; // callback has stored the pointer of p here
        }
    }
    if(enabled)
        rtosc::walk_ports(p.ports, name_buffer, buffer_size,
                          data, walker, expand_bundles, runtime, ranges);
}